

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWInstanceBase.h
# Opt level: O2

void __thiscall
COLLADAFW::InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437>::~InstanceBase
          (InstanceBase<(COLLADAFW::COLLADA_TYPE::ClassId)437> *this)

{
  (this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>).super_Object._vptr_Object =
       (_func_int **)&PTR__InstanceBase_00a03838;
  UniqueId::~UniqueId(&this->mInstanciatedObjectId);
  std::__cxx11::string::~string((string *)&this->mName);
  ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>::~ObjectTemplate
            (&this->super_ObjectTemplate<(COLLADAFW::COLLADA_TYPE::ClassId)437>);
  return;
}

Assistant:

virtual ~InstanceBase() {}